

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestTexture::setColor(SRGBTestTexture *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  Texture2D *pTVar5;
  PixelBufferAccess *this_00;
  int local_20;
  int local_1c;
  int px;
  int py;
  Functions *gl;
  SRGBTestTexture *this_local;
  
  pRVar4 = gles31::Context::getRenderContext(this->m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0xb8);
  dVar3 = getGLTargetType(this);
  getHandle(this);
  (*pcVar1)(dVar3);
  pTVar5 = glu::Texture2D::getRefTexture(&this->m_source);
  tcu::Texture2D::allocLevel(pTVar5,0);
  for (local_1c = 0; local_1c < this->m_height; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < this->m_width; local_20 = local_20 + 1) {
      pTVar5 = glu::Texture2D::getRefTexture(&this->m_source);
      this_00 = tcu::TextureLevelPyramid::getLevel(&pTVar5->super_TextureLevelPyramid,0);
      tcu::PixelBufferAccess::setPixel(this_00,&this->m_color,local_20,local_1c,0);
    }
  }
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0xb8);
  dVar3 = getGLTargetType(this);
  (*pcVar1)(dVar3,0);
  return;
}

Assistant:

void SRGBTestTexture::setColor (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindTexture(this->getGLTargetType(), this->getHandle());

	m_source.getRefTexture().allocLevel(0);

	for (int py = 0; py < m_height; py++)
	{
		for (int px = 0; px < m_width; px++)
		{
			m_source.getRefTexture().getLevel(0).setPixel(m_color, px, py);
		}
	}

	gl.bindTexture(this->getGLTargetType(), 0);
}